

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O1

void __thiscall chrono::fea::ChNodeFEAcurv::ChNodeFEAcurv(ChNodeFEAcurv *this,ChNodeFEAcurv *other)

{
  ChVariablesGenericDiagonalMass *this_00;
  
  ChNodeBase::ChNodeBase((ChNodeBase *)&this->field_0xf8);
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb58d98;
  *(undefined8 *)&this->field_0xf8 = 0xb58e98;
  (this->super_ChNodeFEAbase).m_TotalMass = (other->super_ChNodeFEAbase).m_TotalMass;
  (this->super_ChNodeFEAbase).g_index = (other->super_ChNodeFEAbase).g_index;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = (_func_int **)0xb58b00;
  *(undefined8 *)&this->field_0xf8 = 0xb58ca8;
  *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x20 = 0;
  *(undefined8 *)&this->field_0x28 = 0;
  *(undefined8 *)&this->field_0x30 = 0;
  (this->m_ryy).m_data[0] = 0.0;
  (this->m_ryy).m_data[1] = 0.0;
  (this->m_ryy).m_data[2] = 0.0;
  (this->m_rzz).m_data[0] = 0.0;
  (this->m_rzz).m_data[1] = 0.0;
  (this->m_rzz).m_data[2] = 0.0;
  (this->m_rxx_dt).m_data[0] = 0.0;
  (this->m_rxx_dt).m_data[1] = 0.0;
  (this->m_rxx_dt).m_data[2] = 0.0;
  (this->m_ryy_dt).m_data[0] = 0.0;
  (this->m_ryy_dt).m_data[1] = 0.0;
  (this->m_ryy_dt).m_data[2] = 0.0;
  (this->m_rzz_dt).m_data[0] = 0.0;
  (this->m_rzz_dt).m_data[1] = 0.0;
  (this->m_rzz_dt).m_data[2] = 0.0;
  (this->m_rxx_dtdt).m_data[0] = 0.0;
  (this->m_rxx_dtdt).m_data[1] = 0.0;
  (this->m_rxx_dtdt).m_data[2] = 0.0;
  (this->m_ryy_dtdt).m_data[0] = 0.0;
  (this->m_ryy_dtdt).m_data[1] = 0.0;
  (this->m_ryy_dtdt).m_data[2] = 0.0;
  (this->m_rxx_dtdt).m_data[1] = 0.0;
  (this->m_rxx_dtdt).m_data[2] = 0.0;
  (this->m_ryy_dtdt).m_data[0] = 0.0;
  (this->m_ryy_dtdt).m_data[1] = 0.0;
  (this->m_ryy_dtdt).m_data[2] = 0.0;
  (this->m_rzz_dtdt).m_data[0] = 0.0;
  (this->m_rzz_dtdt).m_data[1] = 0.0;
  (this->m_rzz_dtdt).m_data[2] = 0.0;
  if (other != this) {
    *(undefined8 *)&(this->super_ChNodeFEAbase).field_0x20 =
         *(undefined8 *)&(other->super_ChNodeFEAbase).field_0x20;
    *(undefined8 *)&this->field_0x28 = *(undefined8 *)&other->field_0x28;
    *(undefined8 *)&this->field_0x30 = *(undefined8 *)&other->field_0x30;
    (this->m_ryy).m_data[0] = (other->m_ryy).m_data[0];
    (this->m_ryy).m_data[1] = (other->m_ryy).m_data[1];
    (this->m_ryy).m_data[2] = (other->m_ryy).m_data[2];
    (this->m_rzz).m_data[0] = (other->m_rzz).m_data[0];
    (this->m_rzz).m_data[1] = (other->m_rzz).m_data[1];
    (this->m_rzz).m_data[2] = (other->m_rzz).m_data[2];
    (this->m_rxx_dt).m_data[0] = (other->m_rxx_dt).m_data[0];
    (this->m_rxx_dt).m_data[1] = (other->m_rxx_dt).m_data[1];
    (this->m_rxx_dt).m_data[2] = (other->m_rxx_dt).m_data[2];
    (this->m_ryy_dt).m_data[0] = (other->m_ryy_dt).m_data[0];
    (this->m_ryy_dt).m_data[1] = (other->m_ryy_dt).m_data[1];
    (this->m_ryy_dt).m_data[2] = (other->m_ryy_dt).m_data[2];
    (this->m_rzz_dt).m_data[0] = (other->m_rzz_dt).m_data[0];
    (this->m_rzz_dt).m_data[1] = (other->m_rzz_dt).m_data[1];
    (this->m_rzz_dt).m_data[2] = (other->m_rzz_dt).m_data[2];
    (this->m_rxx_dtdt).m_data[0] = (other->m_rxx_dtdt).m_data[0];
    (this->m_rxx_dtdt).m_data[1] = (other->m_rxx_dtdt).m_data[1];
    (this->m_rxx_dtdt).m_data[2] = (other->m_rxx_dtdt).m_data[2];
    (this->m_ryy_dtdt).m_data[0] = (other->m_ryy_dtdt).m_data[0];
    (this->m_ryy_dtdt).m_data[1] = (other->m_ryy_dtdt).m_data[1];
    (this->m_ryy_dtdt).m_data[2] = (other->m_ryy_dtdt).m_data[2];
    (this->m_rzz_dtdt).m_data[0] = (other->m_rzz_dtdt).m_data[0];
    (this->m_rzz_dtdt).m_data[1] = (other->m_rzz_dtdt).m_data[1];
    (this->m_rzz_dtdt).m_data[2] = (other->m_rzz_dtdt).m_data[2];
  }
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,9);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAbase).field_0x18 = this_00;
  ChVariablesGenericDiagonalMass::operator=
            (this_00,*(ChVariablesGenericDiagonalMass **)&(other->super_ChNodeFEAbase).field_0x18);
  return;
}

Assistant:

ChNodeFEAcurv::ChNodeFEAcurv(const ChNodeFEAcurv& other) : ChNodeFEAbase(other) {
    m_rxx = other.m_rxx;
    m_ryy = other.m_ryy;
    m_rzz = other.m_rzz;
    m_rxx_dt = other.m_rxx_dt;
    m_ryy_dt = other.m_ryy_dt;
    m_rzz_dt = other.m_rzz_dt;
    m_rxx_dtdt = other.m_rxx_dtdt;
    m_ryy_dtdt = other.m_ryy_dtdt;
    m_rzz_dtdt = other.m_rzz_dtdt;

    m_variables = new ChVariablesGenericDiagonalMass(9);
    *m_variables = *other.m_variables;
}